

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O0

int lh_table_resize(lh_table *t,int new_size)

{
  int iVar1;
  lh_table *t_00;
  unsigned_long h_00;
  uint local_3c;
  uint opts;
  unsigned_long h;
  lh_entry *ent;
  lh_table *new_t;
  int new_size_local;
  lh_table *t_local;
  
  t_00 = lh_table_new(new_size,(lh_entry_free_fn *)0x0,t->hash_fn,t->equal_fn);
  if (t_00 == (lh_table *)0x0) {
    t_local._4_4_ = -1;
  }
  else {
    for (h = (unsigned_long)t->head; h != 0; h = *(unsigned_long *)(h + 0x18)) {
      h_00 = lh_get_hash(t_00,*(void **)h);
      local_3c = 0;
      if (*(int *)(h + 8) != 0) {
        local_3c = 4;
      }
      iVar1 = lh_table_insert_w_hash(t_00,*(void **)h,*(void **)(h + 0x10),h_00,local_3c);
      if (iVar1 != 0) {
        lh_table_free(t_00);
        return -1;
      }
    }
    free(t->table);
    t->table = t_00->table;
    t->size = new_size;
    t->head = t_00->head;
    t->tail = t_00->tail;
    free(t_00);
    t_local._4_4_ = 0;
  }
  return t_local._4_4_;
}

Assistant:

int lh_table_resize(struct lh_table *t, int new_size)
{
	struct lh_table *new_t;
	struct lh_entry *ent;

	new_t = lh_table_new(new_size, NULL, t->hash_fn, t->equal_fn);
	if (new_t == NULL)
		return -1;

	for (ent = t->head; ent != NULL; ent = ent->next)
	{
		unsigned long h = lh_get_hash(new_t, ent->k);
		unsigned int opts = 0;
		if (ent->k_is_constant)
			opts = JSON_C_OBJECT_ADD_CONSTANT_KEY;
		if (lh_table_insert_w_hash(new_t, ent->k, ent->v, h, opts) != 0)
		{
			lh_table_free(new_t);
			return -1;
		}
	}
	free(t->table);
	t->table = new_t->table;
	t->size = new_size;
	t->head = new_t->head;
	t->tail = new_t->tail;
	free(new_t);

	return 0;
}